

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

Address * __thiscall cfd::core::Address::operator=(Address *this,Address *object)

{
  AddressType AVar1;
  
  if (this != object) {
    AVar1 = object->addr_type_;
    this->type_ = object->type_;
    this->addr_type_ = AVar1;
    this->witness_ver_ = object->witness_ver_;
    ::std::__cxx11::string::_M_assign((string *)&this->address_);
    ByteData::operator=(&this->hash_,&object->hash_);
    ByteData::operator=(&(this->pubkey_).data_,&(object->pubkey_).data_);
    ByteData256::operator=(&(this->schnorr_pubkey_).data_,&(object->schnorr_pubkey_).data_);
    TaprootScriptTree::operator=(&this->script_tree_,&object->script_tree_);
    Script::operator=(&this->redeem_script_,&object->redeem_script_);
    *(undefined4 *)this->checksum_ = *(undefined4 *)object->checksum_;
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&this->format_data_,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&object->format_data_);
  }
  return this;
}

Assistant:

Address& Address::operator=(const Address& object) {
  if (this != &object) {
    type_ = object.type_;
    addr_type_ = object.addr_type_;
    witness_ver_ = object.witness_ver_;
    address_ = object.address_;
    hash_ = object.hash_;
    pubkey_ = object.pubkey_;
    schnorr_pubkey_ = object.schnorr_pubkey_;
    script_tree_ = object.script_tree_;
    redeem_script_ = object.redeem_script_;
    memcpy(checksum_, object.checksum_, sizeof(checksum_));
    format_data_ = object.format_data_;
  }
  return *this;
}